

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clickrem.c
# Opt level: O0

void dumb_remove_clicks_array
               (int n,DUMB_CLICK_REMOVER **cr,sample_t_conflict **samples,int32 length,
               double halflife)

{
  double in_RDX;
  long in_RSI;
  uint in_EDI;
  DUMB_CLICK_REMOVER *unaff_retaddr;
  int i;
  int local_2c;
  int32 length_00;
  undefined4 in_stack_fffffffffffffff8;
  
  if (in_RSI != 0) {
    local_2c = 0;
    while( true ) {
      length_00 = (int32)((ulong)in_RSI >> 0x20);
      if ((int)in_EDI >> 1 <= local_2c) break;
      dumb_remove_clicks(unaff_retaddr,
                         (sample_t_conflict *)CONCAT44(in_EDI,in_stack_fffffffffffffff8),length_00,
                         (int)in_RSI,in_RDX);
      dumb_remove_clicks(unaff_retaddr,
                         (sample_t_conflict *)CONCAT44(in_EDI,in_stack_fffffffffffffff8),
                         (int32)((ulong)in_RSI >> 0x20),(int)in_RSI,in_RDX);
      local_2c = local_2c + 1;
    }
    if ((in_EDI & 1) != 0) {
      dumb_remove_clicks(unaff_retaddr,
                         (sample_t_conflict *)CONCAT44(in_EDI,in_stack_fffffffffffffff8),length_00,
                         (int)in_RSI,in_RDX);
    }
  }
  return;
}

Assistant:

void DUMBEXPORT dumb_remove_clicks_array(int n, DUMB_CLICK_REMOVER **cr, sample_t **samples, int32 length, double halflife)
{
	if (cr) {
		int i;
		for (i = 0; i < n >> 1; i++) {
			dumb_remove_clicks(cr[i << 1], samples[i], length, 2, halflife);
			dumb_remove_clicks(cr[(i << 1) + 1], samples[i] + 1, length, 2, halflife);
		}
		if (n & 1)
			dumb_remove_clicks(cr[i << 1], samples[i], length, 1, halflife);
	}
}